

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

file_status
ghc::filesystem::detail::status_ex
          (path *p,error_code *ec,file_status *sls,uintmax_t *sz,uintmax_t *nhl,time_t *lwt,
          int recurse_count)

{
  file_type fVar1;
  int iVar2;
  uint uVar3;
  file_status fVar4;
  file_type *pfVar5;
  undefined4 uVar6;
  ushort uVar7;
  undefined4 in_stack_0000000c;
  stat local_c0;
  
  fVar4 = (file_status)std::_V2::system_category();
  sls->_type = none;
  sls[1] = fVar4;
  iVar2 = lstat(*(char **)ec,&local_c0);
  if (iVar2 != 0) {
    pfVar5 = (file_type *)__errno_location();
    fVar1 = *pfVar5;
    sls->_type = fVar1;
    sls[1] = fVar4;
    if ((fVar1 == 0x14) || (fVar1 == regular)) {
      *(undefined4 *)&(p->_path)._M_dataplus._M_p = 1;
    }
    else {
      *(undefined4 *)&(p->_path)._M_dataplus._M_p = 0;
    }
    *(undefined2 *)((long)&(p->_path)._M_dataplus._M_p + 4) = 0xffff;
    return (file_status)p;
  }
  sls->_type = none;
  sls[1] = fVar4;
  uVar3 = (local_c0.st_mode & 0xf000) - 0x1000 >> 0xc;
  switch(uVar3) {
  case 0:
    uVar3 = 7;
    break;
  case 1:
    uVar3 = 6;
    break;
  default:
    uVar3 = 9;
    break;
  case 3:
  case 5:
    break;
  case 7:
    uVar3 = 2;
    break;
  case 9:
    uVar7 = (ushort)local_c0.st_mode & 0xfff;
    *(undefined4 *)&(p->_path)._M_dataplus._M_p = 4;
    *(ushort *)((long)&(p->_path)._M_dataplus._M_p + 4) = uVar7;
    iVar2 = stat(*(char **)ec,&local_c0);
    if (iVar2 == 0) {
      if (sz != (uintmax_t *)0x0) {
        *(undefined4 *)sz = 4;
        *(ushort *)((long)sz + 4) = uVar7;
      }
      uVar3 = (local_c0.st_mode & 0xf000) - 0x1000;
      uVar6 = 9;
      if (uVar3 < 0xc000) {
        uVar6 = *(undefined4 *)(&DAT_001f5a2c + (uVar3 >> 10));
      }
      *(undefined4 *)&(p->_path)._M_dataplus._M_p = uVar6;
      *(ushort *)((long)&(p->_path)._M_dataplus._M_p + 4) = (ushort)local_c0.st_mode & 0xfff;
    }
    goto LAB_00176bba;
  case 0xb:
    uVar3 = 8;
  }
  *(uint *)&(p->_path)._M_dataplus._M_p = uVar3;
  *(ushort *)((long)&(p->_path)._M_dataplus._M_p + 4) = (ushort)local_c0.st_mode & 0xfff;
LAB_00176bba:
  if (nhl != (uintmax_t *)0x0) {
    *nhl = local_c0.st_size;
  }
  if (lwt != (time_t *)0x0) {
    *lwt = local_c0.st_nlink;
  }
  if ((__time_t *)CONCAT44(in_stack_0000000c,recurse_count) != (__time_t *)0x0) {
    *(__time_t *)CONCAT44(in_stack_0000000c,recurse_count) = local_c0.st_mtim.tv_sec;
  }
  return (file_status)p;
}

Assistant:

GHC_INLINE file_status status_ex(const path& p, std::error_code& ec, file_status* sls = nullptr, uintmax_t* sz = nullptr, uintmax_t* nhl = nullptr, time_t* lwt = nullptr, int recurse_count = 0) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    if (recurse_count > 16) {
        ec = detail::make_system_error(0x2A9 /*ERROR_STOPPED_ON_SYMLINK*/);
        return file_status(file_type::unknown);
    }
    WIN32_FILE_ATTRIBUTE_DATA attr;
    if (!::GetFileAttributesExW(p.wstring().c_str(), GetFileExInfoStandard, &attr)) {
        ec = detail::make_system_error();
    }
    else if (attr.dwFileAttributes & FILE_ATTRIBUTE_REPARSE_POINT) {
        path target = resolveSymlink(p, ec);
        file_status result;
        if (!ec && !target.empty()) {
            if (sls) {
                *sls = status_from_INFO(p, &attr, ec);
            }
            return detail::status_ex(target, ec, nullptr, sz, nhl, lwt, recurse_count + 1);
        }
        return file_status(file_type::unknown);
    }
    if (ec) {
        if (detail::is_not_found_error(ec)) {
            return file_status(file_type::not_found);
        }
        return file_status(file_type::none);
    }
    if (nhl) {
        *nhl = 0;
    }
    return detail::status_from_INFO(p, &attr, ec, sz, lwt);
#else
    (void)recurse_count;
    struct ::stat st;
    auto result = ::lstat(p.c_str(), &st);
    if (result == 0) {
        ec.clear();
        file_status fs = detail::file_status_from_st_mode(st.st_mode);
        if (fs.type() == file_type::symlink) {
            result = ::stat(p.c_str(), &st);
            if (result == 0) {
                if (sls) {
                    *sls = fs;
                }
                fs = detail::file_status_from_st_mode(st.st_mode);
            }
        }
        if (sz) {
            *sz = static_cast<uintmax_t>(st.st_size);
        }
        if (nhl) {
            *nhl = st.st_nlink;
        }
        if (lwt) {
            *lwt = st.st_mtime;
        }
        return fs;
    }
    else {
        ec = detail::make_system_error();
        if (detail::is_not_found_error(ec)) {
            return file_status(file_type::not_found, perms::unknown);
        }
        return file_status(file_type::none);
    }
#endif
}